

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O2

void aom_yv12_copy_y_c(YV12_BUFFER_CONFIG *src_ybc,YV12_BUFFER_CONFIG *dst_ybc,int use_crop)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *__src;
  void *__src_00;
  uint8_t *__dest;
  void *__dest_00;
  bool bVar4;
  
  iVar1 = *(int *)(src_ybc->store_buf_adr + (ulong)(use_crop != 0) * 2 + -9);
  iVar2 = *(int *)(src_ybc->store_buf_adr + (ulong)(use_crop != 0) * 2 + -8);
  __src = (src_ybc->field_5).field_0.y_buffer;
  __dest = (dst_ybc->field_5).field_0.y_buffer;
  if ((src_ybc->flags & 8) == 0) {
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      memcpy(__dest,__src,(long)iVar1);
      __src = __src + (src_ybc->field_4).field_0.y_stride;
      __dest = __dest + (dst_ybc->field_4).field_0.y_stride;
    }
  }
  else {
    __src_00 = (void *)((long)__src * 2);
    __dest_00 = (void *)((long)__dest * 2);
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      memcpy(__dest_00,__src_00,(long)iVar1 * 2);
      __src_00 = (void *)((long)__src_00 + (long)(src_ybc->field_4).field_0.y_stride * 2);
      __dest_00 = (void *)((long)__dest_00 + (long)(dst_ybc->field_4).field_0.y_stride * 2);
    }
  }
  return;
}

Assistant:

void aom_yv12_copy_y_c(const YV12_BUFFER_CONFIG *src_ybc,
                       YV12_BUFFER_CONFIG *dst_ybc, int use_crop) {
  int row;
  int width = use_crop ? src_ybc->y_crop_width : src_ybc->y_width;
  int height = use_crop ? src_ybc->y_crop_height : src_ybc->y_height;
  const uint8_t *src = src_ybc->y_buffer;
  uint8_t *dst = dst_ybc->y_buffer;

#if CONFIG_AV1_HIGHBITDEPTH
  if (src_ybc->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *src16 = CONVERT_TO_SHORTPTR(src);
    uint16_t *dst16 = CONVERT_TO_SHORTPTR(dst);
    for (row = 0; row < height; ++row) {
      memcpy(dst16, src16, width * sizeof(uint16_t));
      src16 += src_ybc->y_stride;
      dst16 += dst_ybc->y_stride;
    }
    return;
  }
#endif

  for (row = 0; row < height; ++row) {
    memcpy(dst, src, width);
    src += src_ybc->y_stride;
    dst += dst_ybc->y_stride;
  }
}